

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O2

LY_ERR schema_mount_validate
                 (lysc_ext_instance *ext,lyd_node *sibling,lyd_node *dep_tree,lyd_type data_type,
                 uint32_t val_opts,lyd_node **diff)

{
  lyd_node *plVar1;
  LY_ERR err;
  LY_ERR LVar2;
  char *xpath;
  lyd_node **pplVar3;
  lyd_node *plVar4;
  ly_err_item *eitem;
  lys_module *plVar5;
  ulong uVar6;
  lyd_node_inner *plVar7;
  undefined8 in_stack_ffffffffffffff48;
  undefined7 uStack_b0;
  ly_bool ext_data_free;
  lyd_node *sibling_local;
  ly_set *ref_set;
  lyd_node *dup;
  lyd_node *diff_parent;
  lyd_node *ext_diff;
  lyd_node **local_80;
  lyd_node *local_78;
  ly_ctx *local_70;
  lyd_node *ext_data;
  ly_set *par_set;
  ly_set *set;
  uint32_t temp_lo;
  lyd_node_inner *local_48;
  lyd_node *top_node;
  ulong local_38;
  
  temp_lo = 6;
  ext_data = (lyd_node *)0x0;
  if (sibling == (lyd_node *)0x0) {
    local_48 = (lyd_node_inner *)0x0;
  }
  else {
    local_48 = sibling->parent;
  }
  ext_diff = (lyd_node *)0x0;
  diff_parent = (lyd_node *)0x0;
  ext_data_free = '\0';
  ref_set = (ly_set *)0x0;
  sibling_local = sibling;
  if (sibling == (lyd_node *)0x0) {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/schema_mount.c"
               ,CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0x393));
    return LY_EINT;
  }
  pplVar3 = &ext_data;
  local_80 = diff;
  err = lyplg_ext_get_data(ext->module->ctx,ext,pplVar3,&ext_data_free);
  if (err == LY_SUCCESS) {
    do {
      plVar4 = *pplVar3;
      if (plVar4 == (lyd_node *)0x0) {
        if (sibling_local->schema == (lysc_node *)0x0) {
          plVar5 = (lys_module *)&sibling_local[2].schema;
        }
        else {
          plVar5 = sibling_local->schema->module;
        }
        local_70 = plVar5->ctx;
        set = (ly_set *)0x0;
        par_set = (ly_set *)0x0;
        dup = (lyd_node *)0x0;
        ref_set = (ly_set *)0x0;
        if (ext_data == (lyd_node *)0x0) {
          err = LY_EINVAL;
          lyplg_ext_compile_log((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,"No ext data provided.");
          goto LAB_0019685a;
        }
        err = schema_mount_get_parent_ref(ext,ext_data,&set);
        if ((err != LY_SUCCESS) || (err = ly_set_new(&ref_set), err != LY_SUCCESS))
        goto LAB_0019685a;
        local_78 = (lyd_node *)0x0;
        uVar6 = 0;
        goto LAB_0019699d;
      }
      pplVar3 = &plVar4->next;
    } while ((plVar4->flags & 4) == 0);
    err = LY_EINVAL;
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,"Provided ext data have not been validated.");
  }
  goto LAB_001968c8;
LAB_0019699d:
  err = LY_SUCCESS;
  if (set->count <= uVar6) goto LAB_0019685a;
  plVar7 = (set->field_2).dnodes[uVar6][1].parent;
  local_38 = uVar6;
  xpath = lyxp_get_expr(*(lyxp_expr **)&plVar7->field_0);
  err = lyd_find_xpath3((lyd_node *)local_48,(lyd_node *)local_48,xpath,
                        *(LY_VALUE_FORMAT *)((long)&plVar7->field_0 + 0x18),
                        (plVar7->field_0).node.parent,(lyxp_var *)0x0,&par_set);
  if (err != LY_SUCCESS) {
    lyxp_get_expr(*(lyxp_expr **)&plVar7->field_0);
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,err,"Parent reference \"%s\" evaluation failed.");
    goto LAB_0019685a;
  }
  for (uVar6 = 0; uVar6 < par_set->count; uVar6 = uVar6 + 1) {
    err = lyd_dup_single_to_ctx
                    ((par_set->field_2).dnodes[uVar6],local_70,(lyd_node_inner *)0x0,0x1d,&dup);
    plVar7 = (lyd_node_inner *)dup;
    if (err != LY_SUCCESS) goto LAB_0019685a;
    do {
      dup = (lyd_node *)plVar7;
      plVar7 = dup->parent;
    } while (dup->parent != (lyd_node_inner *)0x0);
    if (local_78 == (lyd_node *)0x0) {
      top_node = (lyd_node *)0x0;
      plVar4 = (lyd_node *)0x0;
LAB_00196aa4:
      err = lyd_insert_sibling(plVar4,dup,&local_78);
      if (err != LY_SUCCESS) goto LAB_0019685a;
      err = ly_set_add(ref_set,dup,'\x01',(uint32_t *)0x0);
    }
    else {
      err = lyd_find_sibling_first(local_78,dup,&top_node);
      if ((err != LY_SUCCESS) && (err != LY_ENOTFOUND)) goto LAB_0019685a;
      plVar4 = local_78;
      if (top_node == (lyd_node *)0x0) goto LAB_00196aa4;
      err = lyd_merge_tree(&local_78,dup,1);
      dup = (lyd_node *)0x0;
    }
    if (err != LY_SUCCESS) goto LAB_0019685a;
    dup = (lyd_node *)0x0;
  }
  uVar6 = local_38 + 1;
  goto LAB_0019699d;
LAB_0019685a:
  ly_set_free(set,(_func_void_void_ptr *)0x0);
  ly_set_free(par_set,(_func_void_void_ptr *)0x0);
  lyd_free_tree(dup);
  plVar4 = sibling_local;
  if (err == LY_SUCCESS) {
    LVar2 = lyd_unlink_siblings((lyd_node *)CONCAT17(ext_data_free,uStack_b0));
    err = LY_SUCCESS;
    if (LVar2 == LY_SUCCESS) {
      pplVar3 = &sibling_local;
      while (plVar1 = *pplVar3, plVar1 != (lyd_node *)0x0) {
        *(byte *)&plVar1->flags = (byte)plVar1->flags & 0xf7;
        pplVar3 = &plVar1->next;
      }
      if ((ref_set->count == 0) ||
         (err = lyd_insert_sibling(sibling_local,*(ref_set->field_2).dnodes,&sibling_local),
         err == LY_SUCCESS)) {
        local_70 = (ly_ctx *)ly_temp_log_options(&temp_lo);
        pplVar3 = &ext_diff;
        if (data_type == LYD_TYPE_DATA_YANG) {
          if (local_80 == (lyd_node **)0x0) {
            pplVar3 = (lyd_node **)0x0;
          }
          err = lyd_validate_all(&sibling_local,(ly_ctx *)0x0,val_opts | 2,pplVar3);
        }
        else {
          if (local_80 == (lyd_node **)0x0) {
            pplVar3 = (lyd_node **)0x0;
          }
          err = lyd_validate_op(plVar4,dep_tree,data_type,pplVar3);
        }
        ly_temp_log_options((uint32_t *)local_70);
        for (uVar6 = 0; uVar6 < ref_set->count; uVar6 = uVar6 + 1) {
          plVar4 = (ref_set->field_2).dnodes[uVar6];
          if (plVar4 == sibling_local) {
            sibling_local = sibling_local->next;
            plVar4 = (ref_set->field_2).dnodes[uVar6];
          }
          lyd_free_tree(plVar4);
        }
        pplVar3 = &sibling_local;
        while (plVar4 = *pplVar3, plVar4 != (lyd_node *)0x0) {
          *(byte *)&plVar4->flags = (byte)plVar4->flags | 8;
          pplVar3 = &plVar4->next;
        }
        lyplg_ext_insert((lyd_node *)local_48,sibling_local);
        if (err == LY_SUCCESS) {
          err = LY_SUCCESS;
          plVar4 = ext_diff;
          if (ext_diff != (lyd_node *)0x0 && local_80 != (lyd_node **)0x0) {
            for (; plVar4 != (lyd_node *)0x0; plVar4 = plVar4->next) {
              *(byte *)&plVar4->flags = (byte)plVar4->flags | 8;
            }
            if (sibling_local == (lyd_node *)0x0) {
              plVar7 = (lyd_node_inner *)0x0;
            }
            else {
              plVar7 = sibling_local->parent;
            }
            err = lyd_dup_single((lyd_node *)plVar7,(lyd_node_inner *)0x0,6,&diff_parent);
            if ((err == LY_SUCCESS) &&
               (err = lyplg_ext_insert(diff_parent,ext_diff), err == LY_SUCCESS)) {
              ext_diff = (lyd_node *)0x0;
              plVar7 = (lyd_node_inner *)diff_parent;
              do {
                diff_parent = (lyd_node *)plVar7;
                if (diff_parent == (lyd_node *)0x0) break;
                plVar7 = diff_parent->parent;
              } while (diff_parent->parent != (lyd_node_inner *)0x0);
              if (diff_parent->schema == (lysc_node *)0x0) {
                plVar5 = (lys_module *)&diff_parent[2].schema;
              }
              else {
                plVar5 = diff_parent->schema->module;
              }
              err = lyd_new_meta(plVar5->ctx,diff_parent,(lys_module *)0x0,"yang:operation","none",0
                                 ,(lyd_meta **)0x0);
              if (err == LY_SUCCESS) {
                err = lyd_diff_merge_all(local_80,diff_parent,1);
              }
            }
          }
        }
        else {
          if (sibling_local->schema == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&sibling_local[2].schema;
          }
          else {
            plVar5 = sibling_local->schema->module;
          }
          eitem = ly_err_first(plVar5->ctx);
          if (eitem == (ly_err_item *)0x0) {
            lyplg_ext_compile_log
                      ((lysc_ctx *)0x0,ext,LY_LLERR,err,"Unknown validation error (err code %d).",
                       (ulong)err);
          }
          else {
            lyplg_ext_compile_log_err(eitem,ext);
          }
        }
      }
    }
  }
  else if (ref_set != (ly_set *)0x0) {
    if (ref_set->count != 0) {
      lyd_free_siblings(*(ref_set->field_2).dnodes);
    }
    ly_set_free(ref_set,(_func_void_void_ptr *)0x0);
    ref_set = (ly_set *)0x0;
  }
LAB_001968c8:
  ly_set_free(ref_set,(_func_void_void_ptr *)0x0);
  lyd_free_siblings((lyd_node *)0x0);
  lyd_free_tree(ext_diff);
  lyd_free_all(diff_parent);
  if (ext_data_free != '\0') {
    lyd_free_all(ext_data);
  }
  return err;
}

Assistant:

static LY_ERR
schema_mount_validate(struct lysc_ext_instance *ext, struct lyd_node *sibling, const struct lyd_node *dep_tree,
        enum lyd_type data_type, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE_LAST, i;
    const struct ly_err_item *err;
    struct lyd_node *iter, *ext_data = NULL, *ref_first = NULL, *orig_parent = lyd_parent(sibling), *op_tree;
    struct lyd_node *ext_diff = NULL, *diff_parent = NULL;
    ly_bool ext_data_free = 0;
    struct ly_set *ref_set = NULL;

    if (!sibling) {
        /* some data had to be parsed for this callback to be called */
        EXT_LOGERR_INT_RET(NULL, ext);
    }

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((ret = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        goto cleanup;
    }

    LY_LIST_FOR(ext_data, iter) {
        if (iter->flags & LYD_NEW) {
            /* must be validated for the parent-reference prefix data to be stored */
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, LY_EINVAL, "Provided ext data have not been validated.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* duplicate the referenced parent nodes into ext context */
    if ((ret = schema_mount_dup_parent_ref(ext, orig_parent, ext_data, LYD_CTX(sibling), &ref_set))) {
        goto cleanup;
    }

    if (data_type != LYD_TYPE_DATA_YANG) {
        /* remember the operation data tree, it may be moved */
        op_tree = sibling;
    }

    /* create accessible tree, remove LYD_EXT to not call this callback recursively */
    LY_CHECK_GOTO(lyd_unlink_siblings(sibling), cleanup);
    LY_LIST_FOR(sibling, iter) {
        iter->flags &= ~LYD_EXT;
    }
    if (ref_set->count) {
        if ((ret = lyd_insert_sibling(sibling, ref_set->dnodes[0], &sibling))) {
            goto cleanup;
        }
    }

    /* only store messages in the context, log as an extension */
    prev_lo = ly_temp_log_options(&temp_lo);

    if (data_type == LYD_TYPE_DATA_YANG) {
        /* validate all the modules with data */
        ret = lyd_validate_all(&sibling, NULL, val_opts | LYD_VALIDATE_PRESENT, diff ? &ext_diff : NULL);
    } else {
        /* validate the operation */
        ret = lyd_validate_op(op_tree, dep_tree, data_type, diff ? &ext_diff : NULL);
    }

    /* restore logging */
    ly_temp_log_options(prev_lo);

    /* restore sibling tree */
    for (i = 0; i < ref_set->count; ++i) {
        if (ref_set->dnodes[i] == sibling) {
            sibling = sibling->next;
        }
        lyd_free_tree(ref_set->dnodes[i]);
    }
    LY_LIST_FOR(sibling, iter) {
        iter->flags |= LYD_EXT;
    }
    lyplg_ext_insert(orig_parent, sibling);

    if (ret) {
        /* log the error in the original context */
        err = ly_err_first(LYD_CTX(sibling));
        if (!err) {
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, ret, "Unknown validation error (err code %d).", ret);
        } else {
            lyplg_ext_compile_log_err(err, ext);
        }
        goto cleanup;
    }

    /* create proper diff */
    if (diff && ext_diff) {
        /* diff nodes from an extension instance */
        LY_LIST_FOR(ext_diff, iter) {
            iter->flags |= LYD_EXT;
        }

        /* create the parent and insert the diff */
        if ((ret = lyd_dup_single(lyd_parent(sibling), NULL, LYD_DUP_WITH_PARENTS | LYD_DUP_NO_META, &diff_parent))) {
            goto cleanup;
        }
        if ((ret = lyplg_ext_insert(diff_parent, ext_diff))) {
            goto cleanup;
        }
        ext_diff = NULL;

        /* go top-level and set the operation */
        while (lyd_parent(diff_parent)) {
            diff_parent = lyd_parent(diff_parent);
        }
        if ((ret = lyd_new_meta(LYD_CTX(diff_parent), diff_parent, NULL, "yang:operation", "none", 0, NULL))) {
            goto cleanup;
        }

        /* finally merge into the global diff */
        if ((ret = lyd_diff_merge_all(diff, diff_parent, LYD_DIFF_MERGE_DEFAULTS))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(ref_set, NULL);
    lyd_free_siblings(ref_first);
    lyd_free_tree(ext_diff);
    lyd_free_all(diff_parent);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    return ret;
}